

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::NameResolver::BeginLoopExpr(NameResolver *this,LoopExpr *expr)

{
  LoopExpr *expr_local;
  NameResolver *this_local;
  
  PushLabel(this,&(expr->block).label);
  ResolveBlockDeclarationVar(this,&(expr->block).decl);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameResolver::BeginLoopExpr(LoopExpr* expr) {
  PushLabel(expr->block.label);
  ResolveBlockDeclarationVar(&expr->block.decl);
  return Result::Ok;
}